

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_compute_nanomips_pbalrsc_branch(DisasContext_conflict6 *ctx,int rs,int rt)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 ret;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int rt_local;
  int rs_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx_00);
  ret = tcg_temp_new_i64(tcg_ctx_00);
  gen_load_gpr(tcg_ctx_00,t,rs);
  if (rt != 0) {
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],(ctx->base).pc_next + 4);
  }
  tcg_gen_shli_i64_mips64el(tcg_ctx_00,t,t,1);
  tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret,(ctx->base).pc_next + 4);
  gen_op_addr_add(ctx,tcg_ctx_00->btarget,ret,t);
  clear_branch_hflags(ctx);
  (ctx->base).is_jmp = DISAS_NORETURN;
  tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_pc,tcg_ctx_00->btarget);
  tcg_gen_lookup_and_goto_ptr_mips64el(tcg_ctx_00);
  tcg_temp_free_i64(tcg_ctx_00,t);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_compute_nanomips_pbalrsc_branch(DisasContext *ctx, int rs,
                                                int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    /* load rs */
    gen_load_gpr(tcg_ctx, t0, rs);

    /* link */
    if (rt != 0) {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], ctx->base.pc_next + 4);
    }

    /* calculate btarget */
    tcg_gen_shli_tl(tcg_ctx, t0, t0, 1);
    tcg_gen_movi_tl(tcg_ctx, t1, ctx->base.pc_next + 4);
    gen_op_addr_add(ctx, tcg_ctx->btarget, t1, t0);

    /* branch completion */
    clear_branch_hflags(ctx);
    ctx->base.is_jmp = DISAS_NORETURN;

    /* unconditional branch to register */
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->btarget);
    tcg_gen_lookup_and_goto_ptr(tcg_ctx);

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}